

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

binary_op_t pugi::impl::anon_unknown_0::xpath_parser::binary_op_t::parse(xpath_lexer *lexer)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  xpath_lexer_string *this;
  binary_op_t bVar5;
  
  uVar4 = 0x400000000;
  iVar3 = 3;
  switch(lexer->_cur_lexeme) {
  case lex_equal:
    uVar2 = 3;
    break;
  case lex_not_equal:
    uVar2 = 4;
    break;
  case lex_less:
    uVar2 = 5;
    goto LAB_001653f8;
  case lex_greater:
    uVar2 = 6;
    goto LAB_001653f8;
  case lex_less_or_equal:
    uVar2 = 7;
    goto LAB_001653f8;
  case lex_greater_or_equal:
    uVar2 = 8;
LAB_001653f8:
    iVar3 = 4;
    break;
  case lex_plus:
    uVar2 = 9;
    goto LAB_00165418;
  case lex_minus:
    uVar2 = 10;
LAB_00165418:
    iVar3 = 5;
LAB_00165442:
    uVar4 = 0x200000000;
    break;
  case lex_multiply:
    uVar2 = 0xb;
    iVar3 = 6;
    goto LAB_00165442;
  case lex_union:
    uVar2 = 0xf;
    uVar4 = 0x100000000;
    iVar3 = 7;
    break;
  default:
    iVar3 = 0;
    uVar4 = 0;
    uVar2 = 0;
    break;
  case lex_string:
    this = &lexer->_cur_lexeme_contents;
    bVar1 = xpath_lexer_string::operator==(this,"or");
    if (bVar1) {
      iVar3 = 1;
      uVar2 = 1;
    }
    else {
      bVar1 = xpath_lexer_string::operator==(this,"and");
      if (bVar1) {
        iVar3 = 2;
        uVar2 = 2;
      }
      else {
        uVar4 = 0x200000000;
        bVar1 = xpath_lexer_string::operator==(this,"div");
        if (bVar1) {
          iVar3 = 6;
          uVar2 = 0xc;
        }
        else {
          bVar1 = xpath_lexer_string::operator==(this,"mod");
          iVar3 = 6;
          if (!bVar1) {
            uVar4 = 0;
            iVar3 = 0;
          }
          uVar2 = 0xd;
          if (!bVar1) {
            uVar2 = 0;
          }
        }
      }
    }
  }
  bVar5.precedence = iVar3;
  bVar5.asttype = (int)(uVar4 | uVar2);
  bVar5.rettype = (int)((uVar4 | uVar2) >> 0x20);
  return bVar5;
}

Assistant:

lexeme_t current() const
		{
			return _cur_lexeme;
		}